

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorldImporter.cpp
# Opt level: O1

cbtCollisionObject * __thiscall
cbtCollisionWorldImporter::createCollisionObject
          (cbtCollisionWorldImporter *this,cbtTransform *startTransform,cbtCollisionShape *shape,
          char *bodyName)

{
  int iVar1;
  int iVar2;
  cbtCollisionObject **ptr;
  undefined8 uVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_00;
  cbtCollisionObject **ppcVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  cbtCollisionObject *colObj;
  char *newname;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  anon_union_8_2_511b660c_for_cbtHashPtr_0 local_60 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  char *local_38;
  
  this_00 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)cbtAlignedAllocInternal(0x178,0x10);
  cbtCollisionObject::cbtCollisionObject((cbtCollisionObject *)this_00);
  *(int *)(this_00->_M_local_buf + 0x160) = *(int *)(this_00->_M_local_buf + 0x160) + 1;
  uVar3 = *(undefined8 *)((startTransform->m_basis).m_el[0].m_floats + 2);
  *(undefined8 *)(((cbtTransform *)(this_00->_M_local_buf + 8))->m_basis).m_el[0].m_floats =
       *(undefined8 *)(startTransform->m_basis).m_el[0].m_floats;
  *(undefined8 *)(this_00->_M_local_buf + 0x10) = uVar3;
  uVar3 = *(undefined8 *)((startTransform->m_basis).m_el[1].m_floats + 2);
  *(undefined8 *)((cbtVector3 *)(this_00->_M_local_buf + 0x18))->m_floats =
       *(undefined8 *)(startTransform->m_basis).m_el[1].m_floats;
  *(undefined8 *)(this_00->_M_local_buf + 0x20) = uVar3;
  uVar3 = *(undefined8 *)((startTransform->m_basis).m_el[2].m_floats + 2);
  *(undefined8 *)((cbtVector3 *)(this_00->_M_local_buf + 0x28))->m_floats =
       *(undefined8 *)(startTransform->m_basis).m_el[2].m_floats;
  *(undefined8 *)(this_00->_M_local_buf + 0x30) = uVar3;
  uVar3 = *(undefined8 *)((startTransform->m_origin).m_floats + 2);
  *(undefined8 *)((cbtVector3 *)(this_00->_M_local_buf + 0x38))->m_floats =
       *(undefined8 *)(startTransform->m_origin).m_floats;
  *(undefined8 *)(this_00->_M_local_buf + 0x40) = uVar3;
  local_68 = this_00;
  (**(code **)(this_00->_M_allocated_capacity + 0x10))(this_00,shape);
  (*this->m_collisionWorld->_vptr_cbtCollisionWorld[9])
            (this->m_collisionWorld,local_68,1,0xffffffff);
  if (bodyName != (char *)0x0) {
    local_38 = duplicateName(this,bodyName);
    local_60[0].m_pointer = local_68;
    cbtHashMap<cbtHashPtr,_const_char_*>::insert
              (&this->m_objectNameMap,(cbtHashPtr *)local_60,&local_38);
    cbtHashString::cbtHashString((cbtHashString *)local_60,local_38);
    cbtHashMap<cbtHashString,_cbtCollisionObject_*>::insert
              (&this->m_nameColObjMap,(cbtHashString *)local_60,(cbtCollisionObject **)&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60[0].m_pointer != &local_50) {
      operator_delete(local_60[0].m_pointer,local_50._M_allocated_capacity + 1);
    }
  }
  iVar1 = (this->m_allocatedCollisionObjects).m_size;
  iVar2 = (this->m_allocatedCollisionObjects).m_capacity;
  if (iVar1 == iVar2) {
    iVar7 = 1;
    if (iVar1 != 0) {
      iVar7 = iVar1 * 2;
    }
    if (iVar2 < iVar7) {
      if (iVar7 == 0) {
        ppcVar4 = (cbtCollisionObject **)0x0;
      }
      else {
        ppcVar4 = (cbtCollisionObject **)cbtAlignedAllocInternal((long)iVar7 << 3,0x10);
      }
      lVar5 = (long)(this->m_allocatedCollisionObjects).m_size;
      if (0 < lVar5) {
        lVar6 = 0;
        do {
          ppcVar4[lVar6] = (this->m_allocatedCollisionObjects).m_data[lVar6];
          lVar6 = lVar6 + 1;
        } while (lVar5 != lVar6);
      }
      ptr = (this->m_allocatedCollisionObjects).m_data;
      if (ptr != (cbtCollisionObject **)0x0) {
        if ((this->m_allocatedCollisionObjects).m_ownsMemory == true) {
          cbtAlignedFreeInternal(ptr);
        }
        (this->m_allocatedCollisionObjects).m_data = (cbtCollisionObject **)0x0;
      }
      (this->m_allocatedCollisionObjects).m_ownsMemory = true;
      (this->m_allocatedCollisionObjects).m_data = ppcVar4;
      (this->m_allocatedCollisionObjects).m_capacity = iVar7;
    }
  }
  iVar1 = (this->m_allocatedCollisionObjects).m_size;
  (this->m_allocatedCollisionObjects).m_data[iVar1] = (cbtCollisionObject *)local_68;
  (this->m_allocatedCollisionObjects).m_size = iVar1 + 1;
  return (cbtCollisionObject *)local_68;
}

Assistant:

cbtCollisionObject* cbtCollisionWorldImporter::createCollisionObject(const cbtTransform& startTransform, cbtCollisionShape* shape, const char* bodyName)
{
	cbtCollisionObject* colObj = new cbtCollisionObject();
	colObj->setWorldTransform(startTransform);
	colObj->setCollisionShape(shape);
	m_collisionWorld->addCollisionObject(colObj);  //todo: flags etc

	if (bodyName)
	{
		char* newname = duplicateName(bodyName);
		m_objectNameMap.insert(colObj, newname);
		m_nameColObjMap.insert(newname, colObj);
	}
	m_allocatedCollisionObjects.push_back(colObj);

	return colObj;
}